

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O2

void mgf_mask(uchar *dst,size_t dlen,uchar *src,size_t slen,mbedtls_md_context_t *md_ctx)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  uchar counter [4];
  uchar mask [64];
  
  mask[0] = '\0';
  mask[1] = '\0';
  mask[2] = '\0';
  mask[3] = '\0';
  mask[4] = '\0';
  mask[5] = '\0';
  mask[6] = '\0';
  mask[7] = '\0';
  mask[8] = '\0';
  mask[9] = '\0';
  mask[10] = '\0';
  mask[0xb] = '\0';
  mask[0xc] = '\0';
  mask[0xd] = '\0';
  mask[0xe] = '\0';
  mask[0xf] = '\0';
  mask[0x10] = '\0';
  mask[0x11] = '\0';
  mask[0x12] = '\0';
  mask[0x13] = '\0';
  mask[0x14] = '\0';
  mask[0x15] = '\0';
  mask[0x16] = '\0';
  mask[0x17] = '\0';
  mask[0x18] = '\0';
  mask[0x19] = '\0';
  mask[0x1a] = '\0';
  mask[0x1b] = '\0';
  mask[0x1c] = '\0';
  mask[0x1d] = '\0';
  mask[0x1e] = '\0';
  mask[0x1f] = '\0';
  mask[0x20] = '\0';
  mask[0x21] = '\0';
  mask[0x22] = '\0';
  mask[0x23] = '\0';
  mask[0x24] = '\0';
  mask[0x25] = '\0';
  mask[0x26] = '\0';
  mask[0x27] = '\0';
  mask[0x28] = '\0';
  mask[0x29] = '\0';
  mask[0x2a] = '\0';
  mask[0x2b] = '\0';
  mask[0x2c] = '\0';
  mask[0x2d] = '\0';
  mask[0x2e] = '\0';
  mask[0x2f] = '\0';
  mask[0x30] = '\0';
  mask[0x31] = '\0';
  mask[0x32] = '\0';
  mask[0x33] = '\0';
  mask[0x34] = '\0';
  mask[0x35] = '\0';
  mask[0x36] = '\0';
  mask[0x37] = '\0';
  mask[0x38] = '\0';
  mask[0x39] = '\0';
  mask[0x3a] = '\0';
  mask[0x3b] = '\0';
  mask[0x3c] = '\0';
  mask[0x3d] = '\0';
  mask[0x3e] = '\0';
  mask[0x3f] = '\0';
  counter[0] = '\0';
  counter[1] = '\0';
  counter[2] = '\0';
  counter[3] = '\0';
  bVar1 = mbedtls_md_get_size(md_ctx->md_info);
  for (; dlen != 0; dlen = dlen - uVar3) {
    uVar3 = (ulong)bVar1;
    if (dlen < bVar1) {
      uVar3 = dlen;
    }
    mbedtls_md_starts(md_ctx);
    mbedtls_md_update(md_ctx,src,slen);
    mbedtls_md_update(md_ctx,counter,4);
    mbedtls_md_finish(md_ctx,mask);
    for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      dst[uVar2] = dst[uVar2] ^ mask[uVar2];
    }
    counter[3] = counter[3] + '\x01';
    dst = dst + uVar2;
  }
  return;
}

Assistant:

static void mgf_mask( unsigned char *dst, size_t dlen, unsigned char *src,
                      size_t slen, mbedtls_md_context_t *md_ctx )
{
    unsigned char mask[MBEDTLS_MD_MAX_SIZE];
    unsigned char counter[4];
    unsigned char *p;
    unsigned int hlen;
    size_t i, use_len;

    memset( mask, 0, MBEDTLS_MD_MAX_SIZE );
    memset( counter, 0, 4 );

    hlen = mbedtls_md_get_size( md_ctx->md_info );

    // Generate and apply dbMask
    //
    p = dst;

    while( dlen > 0 )
    {
        use_len = hlen;
        if( dlen < hlen )
            use_len = dlen;

        mbedtls_md_starts( md_ctx );
        mbedtls_md_update( md_ctx, src, slen );
        mbedtls_md_update( md_ctx, counter, 4 );
        mbedtls_md_finish( md_ctx, mask );

        for( i = 0; i < use_len; ++i )
            *p++ ^= mask[i];

        counter[3]++;

        dlen -= use_len;
    }
}